

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  size_t *psVar1;
  byte *pbVar2;
  ulong uVar3;
  ZSTD_CDict *cdict;
  int iVar4;
  ZSTD_EndDirective ZVar5;
  BYTE *istart_1;
  void *pvVar6;
  byte *pbVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ZSTD_CCtx_params *pZVar11;
  undefined8 *puVar12;
  size_t sVar13;
  ulong uVar14;
  BYTE *istart;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  uint blockToFlush;
  bool bVar18;
  ZSTD_CCtx_params in_stack_ffffffffffffff28;
  
  uVar3 = output->pos;
  sVar9 = output->size - uVar3;
  if (output->size < uVar3) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5234,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  uVar8 = input->size;
  uVar14 = input->pos;
  sVar13 = uVar8 - uVar14;
  if (uVar8 < uVar14) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5235,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (mtctx->singleBlockingThread != 0) {
    sVar9 = ZSTD_compressStream2(mtctx->cctxPool->cctx[0],output,input,endOp);
    return sVar9;
  }
  if ((endOp == ZSTD_e_continue) && (mtctx->frameEnded != 0)) {
    return 0xffffffffffffffc4;
  }
  iVar4 = (mtctx->params).rsyncable;
  if ((((iVar4 == 0) && (mtctx->nextJobID == 0)) && ((mtctx->inBuff).filled == 0)) &&
     ((endOp == ZSTD_e_end && (mtctx->jobReady == 0)))) {
    uVar10 = 0;
    if (sVar13 < 0x20000) {
      uVar10 = (ulong)(0x20000U - (int)sVar13 >> 0xb);
    }
    if (uVar10 + (sVar13 >> 8) + sVar13 <= sVar9) {
      pvVar6 = output->dst;
      pvVar15 = input->src;
      cdict = mtctx->cdict;
      pZVar11 = &mtctx->params;
      puVar12 = (undefined8 *)&stack0xffffffffffffff28;
      for (lVar16 = 0x12; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar12 = *(undefined8 *)pZVar11;
        pZVar11 = (ZSTD_CCtx_params *)&(pZVar11->cParams).chainLog;
        puVar12 = puVar12 + 1;
      }
      sVar9 = ZSTDMT_compress_advanced_internal
                        (mtctx,(void *)(uVar3 + (long)pvVar6),sVar9,(void *)(uVar14 + (long)pvVar15)
                         ,sVar13,cdict,in_stack_ffffffffffffff28);
      if (0xffffffffffffff88 < sVar9) {
        return sVar9;
      }
      input->pos = input->size;
      output->pos = output->pos + sVar9;
      mtctx->frameEnded = 1;
      mtctx->allJobsCompleted = 1;
      return 0;
    }
  }
  blockToFlush = 1;
  if (mtctx->jobReady == 0) {
    if (uVar14 < uVar8) {
      pvVar6 = (mtctx->inBuff).buffer.start;
      if (pvVar6 == (void *)0x0) {
        if ((mtctx->inBuff).filled != 0) {
          __assert_fail("mtctx->inBuff.filled == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5257,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        iVar4 = ZSTDMT_tryGetInputRange(mtctx);
        if ((iVar4 == 0) && (mtctx->doneJobID == mtctx->nextJobID)) {
          __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x525d,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        pvVar6 = (mtctx->inBuff).buffer.start;
        uVar14 = input->pos;
        if (pvVar6 != (void *)0x0) {
          uVar8 = input->size;
          iVar4 = (mtctx->params).rsyncable;
          goto LAB_001518e9;
        }
        blockToFlush = 1;
      }
      else {
LAB_001518e9:
        pvVar15 = (void *)(uVar14 + (long)input->src);
        uVar3 = (mtctx->inBuff).filled;
        uVar10 = mtctx->targetSectionSize - uVar3;
        if (uVar8 - uVar14 < uVar10) {
          uVar10 = uVar8 - uVar14;
        }
        uVar8 = uVar10;
        bVar18 = false;
        if ((iVar4 != 0) && (bVar18 = false, 0x1f < uVar10 + uVar3)) {
          if (uVar3 < 0x20) {
            if (uVar3 == 0) {
              uVar14 = 0;
            }
            else {
              uVar8 = 0;
              uVar14 = 0;
              do {
                uVar14 = uVar14 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar6 + uVar8) + 10;
                uVar8 = uVar8 + 1;
              } while (uVar3 != uVar8);
            }
            uVar17 = 0x20 - uVar3;
            uVar8 = 0;
            do {
              uVar14 = uVar14 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar15 + uVar8) + 10;
              uVar8 = uVar8 + 1;
            } while (uVar17 != uVar8);
          }
          else {
            lVar16 = -0x20;
            uVar17 = 0;
            uVar14 = 0;
            do {
              uVar14 = uVar14 * -0x30e44323485a9b9d +
                       (ulong)*(byte *)((long)pvVar6 + lVar16 + uVar3) + 10;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0);
          }
          do {
            bVar18 = uVar17 < uVar10;
            uVar8 = uVar10;
            if (!bVar18) break;
            pbVar2 = (byte *)((long)pvVar15 + (uVar17 - 0x20));
            pbVar7 = (byte *)((long)pvVar6 + uVar17 + (uVar3 - 0x20));
            if (0x1f < uVar17) {
              pbVar7 = pbVar2;
            }
            uVar14 = (uVar14 - ((ulong)*pbVar7 + 10) * (mtctx->rsync).primePower) *
                     -0x30e44323485a9b9d + (ulong)pbVar2[0x20] + 10;
            uVar17 = uVar17 + 1;
            uVar8 = uVar17;
          } while (((mtctx->rsync).hitMask & ~uVar14) != 0);
        }
        if ((mtctx->inBuff).buffer.capacity < mtctx->targetSectionSize) {
          __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5266,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        ZVar5 = ZSTD_e_flush;
        if (!bVar18) {
          ZVar5 = endOp;
        }
        if (endOp == ZSTD_e_continue) {
          endOp = ZVar5;
        }
        memcpy((void *)((long)pvVar6 + uVar3),pvVar15,uVar8);
        uVar14 = input->pos + uVar8;
        input->pos = uVar14;
        psVar1 = &(mtctx->inBuff).filled;
        *psVar1 = *psVar1 + uVar8;
        blockToFlush = (uint)(uVar8 == 0);
      }
      ZVar5 = ZSTD_e_flush;
      if (input->size <= uVar14) {
        ZVar5 = endOp;
      }
      if (endOp == ZSTD_e_end) {
        endOp = ZVar5;
      }
      if (mtctx->jobReady != 0) goto LAB_00151830;
    }
    uVar3 = (mtctx->inBuff).filled;
    if (((uVar3 < mtctx->targetSectionSize) && (endOp == ZSTD_e_continue || uVar3 == 0)) &&
       ((endOp != ZSTD_e_end || (endOp = ZSTD_e_end, mtctx->frameEnded != 0)))) goto LAB_0015184e;
  }
LAB_00151830:
  sVar9 = (mtctx->inBuff).filled;
  if (mtctx->targetSectionSize < sVar9) {
    __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5277,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  ZSTDMT_createCompressionJob(mtctx,sVar9,endOp);
LAB_0015184e:
  sVar13 = ZSTDMT_flushProduced(mtctx,output,blockToFlush,endOp);
  sVar9 = sVar13 + (sVar13 == 0);
  if (input->size <= input->pos) {
    sVar9 = sVar13;
  }
  return sVar9;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if (mtctx->singleBlockingThread) {  /* delegate to single-thread (synchronous) */
        return ZSTD_compressStream2(mtctx->cctxPool->cctx[0], output, input, endOp);
    }

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* single-pass shortcut (note : synchronous-mode) */
    if ( (!mtctx->params.rsyncable)   /* rsyncable mode is disabled */
      && (mtctx->nextJobID == 0)      /* just started */
      && (mtctx->inBuff.filled == 0)  /* nothing buffered */
      && (!mtctx->jobReady)           /* no job already created */
      && (endOp == ZSTD_e_end)        /* end order */
      && (output->size - output->pos >= ZSTD_compressBound(input->size - input->pos)) ) { /* enough space in dst */
        size_t const cSize = ZSTDMT_compress_advanced_internal(mtctx,
                (char*)output->dst + output->pos, output->size - output->pos,
                (const char*)input->src + input->pos, input->size - input->pos,
                mtctx->cdict, mtctx->params);
        if (ZSTD_isError(cSize)) return cSize;
        input->pos = input->size;
        output->pos += cSize;
        mtctx->allJobsCompleted = 1;
        mtctx->frameEnded = 1;
        return 0;
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
        if ((input->pos < input->size) && (endOp == ZSTD_e_end))
            endOp = ZSTD_e_flush;   /* can't end now : not all input consumed */
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) );
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}